

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

int Maj3_ManFindFanin(Maj3_Man_t *p,int i,int *pFanins)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  
  p->nLits[2] = 0;
  p->nLits[0] = 0;
  p->nLits[1] = 0;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < i) {
    uVar4 = (ulong)(uint)i;
  }
  iVar6 = 0;
  do {
    if (uVar4 == uVar3) {
      return iVar6;
    }
    iVar1 = p->VarMarks[i][uVar3];
    if (-1 < iVar1) {
      lVar5 = (long)iVar6;
      if (iVar1 == 1) {
        p->nLits[2] = p->nLits[2] + 1;
      }
      else {
        if (iVar1 == 0) {
          __assert_fail("p->VarMarks[i][f] > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                        ,0xb2,"int Maj3_ManFindFanin(Maj3_Man_t *, int, int *)");
        }
        iVar2 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar1);
        iVar1 = p->VarMarks[i][uVar3];
        if (iVar2 == 0) {
          iVar2 = Abc_Var2Lit(iVar1,0);
          iVar1 = p->nLits[0];
          p->nLits[0] = iVar1 + 1;
          p->pLits[0][iVar1] = iVar2;
          goto LAB_004a6148;
        }
        iVar2 = Abc_Var2Lit(iVar1,1);
        iVar1 = p->nLits[1];
        p->nLits[1] = iVar1 + 1;
        p->nLits[(long)iVar1 + -0x20] = iVar2;
      }
      iVar6 = iVar6 + 1;
      pFanins[lVar5] = (int)uVar3;
    }
LAB_004a6148:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static inline int Maj3_ManFindFanin( Maj3_Man_t * p, int i, int * pFanins )
{
    int f, nFanins = 0;
    p->nLits[0] = p->nLits[1] = p->nLits[2] = 0;
    for ( f = 0; f < i; f++ )
    {
        if ( p->VarMarks[i][f] < 0 )
            continue;
        assert( p->VarMarks[i][f] > 0 );
        if ( p->VarMarks[i][f] == 1 ) // fixed
        {
            p->nLits[2]++;
            pFanins[nFanins++] = f;
        }
        else if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, p->VarMarks[i][f]) ) // pos
        {
            p->pLits[1][p->nLits[1]++] = Abc_Var2Lit(p->VarMarks[i][f], 1);
            pFanins[nFanins++] = f;
        }
        else // neg
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(p->VarMarks[i][f], 0);
    }
    return nFanins;
}